

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

void __thiscall DetectorSS::Mergebmp(DetectorSS *this,uchar *bmp1,uchar *bmp2,int start,int len)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  for (iVar1 = 0; iVar1 < len; iVar1 = (iVar1 - uVar2) + 8) {
    iVar3 = iVar1 + start >> 3;
    uVar2 = iVar1 + start & 7;
    bmp1[iVar3] = bmp1[iVar3] | (byte)(0xff >> uVar2) & bmp2[iVar3];
  }
  return;
}

Assistant:

void DetectorSS::Mergebmp(unsigned char* bmp1, unsigned char* bmp2,
	int start, int len) {
	int curlen = 0;
	while (curlen < len) {
		unsigned char temp = 0;
		int n = start + curlen;
		int index = n >> 3;
		int pos = n & 0x00000007;

		temp = bmp2[index] & (0xff >> pos);
		bmp1[index] |= temp;
		curlen += 8 - pos;
	}
}